

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O2

void __thiscall GB::cp_mr(GB *this,u16 mr)

{
  u8 x;
  
  if ((this->s).op_tick == 0xe) {
    x = Read(this,mr);
    sub(this,x,'\0');
    (this->s).op_tick = -2;
  }
  return;
}

Assistant:

void GB::cp_mr(u16 mr) {
  switch (s.op_tick) {
    case 14: sub(Read(mr)); op_done(); break;
  }
}